

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O1

int dwarf_get_macro_import
              (Dwarf_Macro_Context macro_context,Dwarf_Unsigned op_number,
              Dwarf_Unsigned *target_offset,Dwarf_Error *error)

{
  Dwarf_Small DVar1;
  Dwarf_Small *pDVar2;
  Dwarf_Debug pDVar3;
  Dwarf_Unsigned _ltmp;
  Dwarf_Unsigned local_28;
  
  if (macro_context == (Dwarf_Macro_Context)0x0) {
    pDVar3 = (Dwarf_Debug)0x0;
  }
  else {
    if (macro_context->mc_sentinel == 0xada) {
      pDVar3 = macro_context->mc_dbg;
      if (macro_context->mc_macro_ops_count <= op_number) {
        _dwarf_error(pDVar3,error,0x143);
        return 1;
      }
      DVar1 = macro_context->mc_ops[op_number].mo_opcode;
      pDVar2 = macro_context->mc_ops[op_number].mo_data;
      if ((DVar1 != '\n') && (DVar1 != '\a')) {
        return -1;
      }
      local_28 = 0;
      if (pDVar2 + macro_context->mc_offset_size <=
          macro_context->mc_macro_header + macro_context->mc_total_length) {
        (*pDVar3->de_copy_word)(&local_28,pDVar2,(ulong)macro_context->mc_offset_size);
        *target_offset = local_28;
        return 0;
      }
      _dwarf_error_string(pDVar3,error,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      return 1;
    }
    pDVar3 = macro_context->mc_dbg;
  }
  _dwarf_error_string(pDVar3,error,0x142,
                      "DW_DLE_BAD_MACRO_HEADER_POINTER  NULL header or corrupt header");
  return 1;
}

Assistant:

int
dwarf_get_macro_import(Dwarf_Macro_Context macro_context,
    Dwarf_Unsigned   op_number,
    Dwarf_Unsigned * target_offset,
    Dwarf_Error *error)
{
    Dwarf_Unsigned supoffset = 0;
    Dwarf_Debug dbg = 0;
    unsigned macop = 0;
    struct Dwarf_Macro_Operator_s *curop = 0;
    Dwarf_Small *mdata = 0;
    Dwarf_Byte_Ptr startptr =  0;
    Dwarf_Byte_Ptr endptr =  0;

    CHECKNULLCONTEXT(macro_context,dbg,error);
    startptr = macro_context->mc_macro_header;
    endptr = startptr + macro_context->mc_total_length;
    dbg = macro_context->mc_dbg;
    if (op_number >= macro_context->mc_macro_ops_count) {
        _dwarf_error(dbg, error,DW_DLE_BAD_MACRO_INDEX);
        return DW_DLV_ERROR;
    }
    curop = macro_context->mc_ops + op_number;
    macop = curop->mo_opcode;
    mdata = curop->mo_data;
    if (macop != DW_MACRO_import && macop != DW_MACRO_import_sup) {
        return DW_DLV_NO_ENTRY;
    }
    READ_UNALIGNED_CK(dbg,supoffset,Dwarf_Unsigned,
        mdata,macro_context->mc_offset_size,
        error,endptr);
    *target_offset = supoffset;
    return DW_DLV_OK;
}